

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::processElemDeclAttrs
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,XMLCh **valueConstraint
          ,bool isTopLevel)

{
  short *psVar1;
  short *psVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  undefined4 extraout_var_00;
  XMLCh *pXVar7;
  long lVar8;
  uint uVar9;
  long *plVar4;
  
  iVar3 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,&SchemaSymbols::fgATT_FIXED);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 == (long *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x150))(plVar4);
  }
  pXVar6 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NILLABLE,Boolean);
  iVar3 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_DEFAULT);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  uVar9 = 0;
  if (plVar4 == (long *)0x0) {
    pXVar7 = (XMLCh *)0x0;
  }
  else {
    pXVar7 = (XMLCh *)(**(code **)(*plVar4 + 0x150))(plVar4);
  }
  *valueConstraint = pXVar7;
  if (pXVar5 != (XMLCh *)0x0) {
    if (pXVar7 != (XMLCh *)0x0) {
      pXVar7 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x34,pXVar7,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    *valueConstraint = pXVar5;
    uVar9 = 4;
  }
  if ((pXVar6 != (XMLCh *)0x0) && (*pXVar6 != L'\0')) {
    if (pXVar6 != L"true") {
      lVar8 = 0;
      do {
        psVar1 = (short *)((long)pXVar6 + lVar8);
        if (*psVar1 == 0) {
          if ((pXVar6 == L"1") || (*(short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar8) == 0))
          goto LAB_0033c7af;
          goto LAB_0033c786;
        }
        psVar2 = (short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar8);
        lVar8 = lVar8 + 2;
      } while (*psVar1 == *psVar2);
      if (pXVar6 != L"1") {
LAB_0033c786:
        lVar8 = 0;
        do {
          psVar1 = (short *)((long)pXVar6 + lVar8);
          if (*psVar1 == 0) {
            if (*(short *)((long)&fgValueOne + lVar8) == 0) goto LAB_0033c7af;
            break;
          }
          psVar2 = (short *)((long)&fgValueOne + lVar8);
          lVar8 = lVar8 + 2;
        } while (*psVar1 == *psVar2);
        goto LAB_0033c7b2;
      }
    }
LAB_0033c7af:
    uVar9 = uVar9 | 1;
  }
LAB_0033c7b2:
  if (!isTopLevel) goto LAB_0033c86f;
  pXVar5 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_ABSTRACT,Boolean);
  if ((pXVar5 != (XMLCh *)0x0) && (*pXVar5 != L'\0')) {
    if (pXVar5 != L"true") {
      lVar8 = 0;
      do {
        psVar1 = (short *)((long)pXVar5 + lVar8);
        if (*psVar1 == 0) {
          if ((pXVar5 == L"1") || (*(short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar8) == 0))
          goto LAB_0033c855;
          goto LAB_0033c82d;
        }
        psVar2 = (short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar8);
        lVar8 = lVar8 + 2;
      } while (*psVar1 == *psVar2);
      if (pXVar5 != L"1") {
LAB_0033c82d:
        lVar8 = 0;
        do {
          psVar1 = (short *)((long)pXVar5 + lVar8);
          if (*psVar1 == 0) {
            if (*(short *)((long)&fgValueOne + lVar8) == 0) goto LAB_0033c855;
            break;
          }
          psVar2 = (short *)((long)&fgValueOne + lVar8);
          lVar8 = lVar8 + 2;
        } while (*psVar1 == *psVar2);
        goto LAB_0033c858;
      }
    }
LAB_0033c855:
    uVar9 = uVar9 | 2;
  }
LAB_0033c858:
  iVar3 = parseFinalSet(this,elem,3,false);
  elemDecl->fFinalSet = iVar3;
LAB_0033c86f:
  iVar3 = parseBlockSet(this,elem,0,false);
  elemDecl->fBlockSet = iVar3;
  elemDecl->fMiscFlags = uVar9;
  return;
}

Assistant:

void TraverseSchema::processElemDeclAttrs(const DOMElement* const elem,
                                          SchemaElementDecl* const elemDecl,
                                          const XMLCh*& valueConstraint,
                                          bool isTopLevel)
{
    int elementMiscFlags = 0;
    const XMLCh* fixedVal = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);
    const XMLCh* nillable = getElementAttValue(elem, SchemaSymbols::fgATT_NILLABLE, DatatypeValidator::Boolean);

    // check constraint value
    valueConstraint = getElementAttValue(elem, SchemaSymbols::fgATT_DEFAULT);
    if (fixedVal)
    {
        elementMiscFlags |= SchemaSymbols::XSD_FIXED;

        // if both default and fixed, emit an error
        if (valueConstraint)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::ElementWithFixedAndDefault, getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName));

        // set constraint value to the fixed one
        valueConstraint = fixedVal;
    }

    // check nillable
    if (nillable && *nillable) {

        if (XMLString::equals(nillable, SchemaSymbols::fgATTVAL_TRUE)
            || XMLString::equals(nillable, fgValueOne)) {
            elementMiscFlags |= SchemaSymbols::XSD_NILLABLE;
        }
    }

    if (isTopLevel)
    {
        const XMLCh* bAbstract = getElementAttValue(elem, SchemaSymbols::fgATT_ABSTRACT, DatatypeValidator::Boolean);
        if (bAbstract && *bAbstract) {

            if (XMLString::equals(bAbstract, SchemaSymbols::fgATTVAL_TRUE)
                || XMLString::equals(bAbstract, fgValueOne)) {
                elementMiscFlags |= SchemaSymbols::XSD_ABSTRACT;
            }
        }

        elemDecl->setFinalSet(parseFinalSet(elem, EC_Final));
    }

    elemDecl->setBlockSet(parseBlockSet(elem, ES_Block));
    elemDecl->setMiscFlags(elementMiscFlags);
}